

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O3

quat quat_create_from_axis_angle(vec3 axis,float angle)

{
  undefined1 auVar1 [16];
  float fVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  quat qVar8;
  
  fVar2 = axis.z;
  auVar3._0_8_ = axis._0_8_;
  auVar3._8_8_ = axis._0_8_;
  fVar4 = SQRT(fVar2 * fVar2 + axis.x * axis.x + axis.y * axis.y);
  fVar5 = 0.0;
  fVar6 = 0.0;
  fVar7 = 0.0;
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    fVar5 = fVar2 / fVar4;
    auVar1._4_4_ = fVar4;
    auVar1._0_4_ = fVar4;
    auVar1._8_4_ = fVar4;
    auVar1._12_4_ = fVar4;
    auVar3 = divps(auVar3,auVar1);
    fVar6 = auVar3._0_4_;
    fVar7 = auVar3._4_4_;
  }
  fVar2 = sinf(angle * 0.5);
  qVar8.z = fVar5 * fVar2;
  qVar8.x = fVar2 * fVar6;
  qVar8.y = fVar2 * fVar7;
  fVar6 = cosf(angle * 0.5);
  qVar8.w = fVar6;
  return qVar8;
}

Assistant:

quat quat_create_from_axis_angle(vec3 axis, float angle) {
    axis = vec3_normalize(axis);
    float temp = sinf(angle / 2.0f);
    float x = temp * axis.x;
    float y = temp * axis.y;
    float z = temp * axis.z;
    float w = cosf(angle / 2.0f);
    return quat_create(x, y, z, w);
}